

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNHairBuilderSAH<8,_embree::CurveNv<8>,_embree::LineMi<8>,_embree::PointMi<8>_>::
build(BVHNHairBuilderSAH<8,_embree::CurveNv<8>,_embree::LineMi<8>,_embree::PointMi<8>_> *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  BVHN<8> *this_00;
  Scene *pSVar4;
  PrimRef *pPVar5;
  MemoryMonitorInterface *pMVar6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  PrimRef *pPVar11;
  ulong uVar12;
  ulong uVar13;
  NodeRefPtr<8> root;
  size_t i;
  long lVar14;
  mvector<PrimRef> *prims;
  ulong numPrimRefs;
  ulong uVar15;
  Set local_114;
  Create local_113;
  Set local_112;
  Create local_111;
  mvector<PrimRef> *local_110;
  Settings *local_108;
  double local_100;
  PrimInfo pinfo;
  anon_class_8_1_8991fb9c reportFinishedRange;
  anon_class_8_1_8991fb9c createLeaf;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((this->settings).finished_range_threshold != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x20);
  }
  this_00 = this->bvh;
  pSVar4 = this->scene;
  numPrimRefs = (pSVar4->world).numBezierCurves + (pSVar4->world).numLineSegments +
                (pSVar4->world).numPoints;
  if (numPrimRefs == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    sVar7 = (this->prims).size_alloced;
    pPVar5 = (this->prims).items;
    if (pPVar5 != (PrimRef *)0x0) {
      if (sVar7 << 5 < 0x1c00000) {
        alignedFree(pPVar5);
      }
      else {
        os_free(pPVar5,sVar7 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar7 != 0) {
      pMVar6 = (this->prims).alloc.device;
      (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar7 * -0x20,1);
    }
    (this->prims).size_active = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  else {
    std::__cxx11::to_string((string *)&createLeaf,8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_78.field_1,"avx::BVH",(string *)&createLeaf);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_78.field_1,"HairBuilderSAH");
    local_100 = BVHN<8>::preBuild(this_00,(string *)&pinfo);
    std::__cxx11::string::~string((string *)&pinfo);
    std::__cxx11::string::~string((string *)&local_78.field_1);
    std::__cxx11::string::~string((string *)&createLeaf);
    uVar12 = (this->prims).size_alloced;
    uVar13 = uVar12;
    if ((uVar12 < numPrimRefs) && (uVar15 = uVar12, uVar13 = numPrimRefs, uVar12 != 0)) {
      for (; uVar13 = uVar15, uVar15 < numPrimRefs; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0))
      {
      }
    }
    psVar1 = &(this->prims).size_active;
    if (numPrimRefs < (this->prims).size_active) {
      *psVar1 = numPrimRefs;
    }
    local_108 = &this->settings;
    prims = &this->prims;
    if (uVar12 == uVar13) {
      *psVar1 = numPrimRefs;
    }
    else {
      pMVar6 = (this->prims).alloc.device;
      pPVar5 = (this->prims).items;
      uVar12 = uVar13 << 5;
      local_110 = prims;
      (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar12,0);
      if (uVar12 < 0x1c00000) {
        pPVar11 = (PrimRef *)alignedMalloc(uVar12,0x20);
      }
      else {
        pPVar11 = (PrimRef *)os_malloc(uVar12,&(this->prims).alloc.hugepages);
      }
      (this->prims).items = pPVar11;
      lVar14 = 0;
      for (uVar12 = 0; uVar12 < *psVar1; uVar12 = uVar12 + 1) {
        puVar3 = (undefined8 *)((long)&(pPVar5->lower).field_0 + lVar14);
        uVar8 = puVar3[1];
        uVar9 = puVar3[2];
        uVar10 = puVar3[3];
        puVar2 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar14);
        *puVar2 = *puVar3;
        puVar2[1] = uVar8;
        puVar2[2] = uVar9;
        puVar2[3] = uVar10;
        lVar14 = lVar14 + 0x20;
      }
      sVar7 = (this->prims).size_alloced;
      if (pPVar5 != (PrimRef *)0x0) {
        if (sVar7 << 5 < 0x1c00000) {
          alignedFree(pPVar5);
        }
        else {
          os_free(pPVar5,sVar7 << 5,(this->prims).alloc.hugepages);
        }
      }
      prims = local_110;
      if (sVar7 != 0) {
        pMVar6 = (local_110->alloc).device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar7 * -0x20,1);
      }
      (this->prims).size_active = numPrimRefs;
      (this->prims).size_alloced = uVar13;
    }
    avx::createPrimRefArray
              (&pinfo,this->scene,MTY_CURVES,false,numPrimRefs,prims,
               &(this->scene->progressInterface).super_BuildProgressMonitor);
    uVar12 = pinfo.end - pinfo.begin;
    uVar13 = (ulong)((uint)uVar12 & 7);
    lVar14 = uVar13 * 0x59 + 0x16;
    if (uVar13 == 0) {
      lVar14 = 0;
    }
    FastAllocator::init_estimate
              (&this->bvh->alloc,(uVar12 >> 3) * 0x2de + (uVar12 * 0x1c0 >> 5) + lVar14);
    (this->settings).branchingFactor = 8;
    (this->settings).maxDepth = 0x28;
    for (sVar7 = 0; (8UL >> sVar7 & 1) == 0; sVar7 = sVar7 + 1) {
    }
    (this->settings).logBlockSize = sVar7;
    (this->settings).minLeafSize = 8;
    (this->settings).maxLeafSize = 8;
    uVar12 = 0xffffffffffffffff;
    if (999999 < numPrimRefs) {
      uVar12 = numPrimRefs / 1000;
    }
    (this->settings).finished_range_threshold = uVar12;
    local_78._0_8_ = &this->bvh->alloc;
    reportFinishedRange.this = this;
    createLeaf.this = this;
    root = BVHBuilderHair::
           build<embree::NodeRefPtr<8>,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set,embree::OBBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::OBBNode_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::BVHNHairBuilderSAH<8,embree::CurveNv<8>,embree::LineMi<8>,embree::PointMi<8>>::build()::_lambda(embree::PrimRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::Scene::BuildProgressMonitorInterface,embree::avx::BVHNHairBuilderSAH<8,embree::CurveNv<8>,embree::LineMi<8>,embree::PointMi<8>>::build()::_lambda(embree::range<unsigned_long>const&)_1_>
                     ((CreateAlloc *)&local_78.field_1,&local_111,&local_112,&local_113,&local_114,
                      &createLeaf,&this->scene->progressInterface,&reportFinishedRange,this->scene,
                      (this->prims).items,&pinfo,*local_108);
    local_78._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    local_78._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_68 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    uStack_60 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    local_58 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    uStack_50 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_48 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    uStack_40 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    BVHN<8>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78.field_1,pinfo.end - pinfo.begin);
    if ((this->settings).finished_range_threshold != 0xffffffffffffffff) {
      root.ptr = (size_t)prims;
      FastAllocator::share(&this->bvh->alloc,prims);
    }
    if ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
      sVar7 = (this->prims).size_alloced;
      pPVar5 = (this->prims).items;
      if (pPVar5 != (PrimRef *)0x0) {
        root.ptr = sVar7 << 5;
        if (root.ptr < (mvector<PrimRef> *)0x1c00000) {
          alignedFree(pPVar5);
        }
        else {
          os_free(pPVar5,root.ptr,(this->prims).alloc.hugepages);
        }
      }
      if (sVar7 != 0) {
        pMVar6 = (prims->alloc).device;
        root.ptr = sVar7 * -0x20;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,root.ptr,1);
      }
      *psVar1 = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
    }
    BVHN<8>::cleanup(this->bvh,(EVP_PKEY_CTX *)root.ptr);
    BVHN<8>::postBuild(this->bvh,local_100);
  }
  return;
}

Assistant:

void build() 
      {
        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.unshare(prims);

        /* fast path for empty BVH */
        const size_t numPrimitives = scene->getNumPrimitives(Geometry::MTY_CURVES,false);
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "HairBuilderSAH");

        /* create primref array */
        prims.resize(numPrimitives);
        const PrimInfo pinfo = createPrimRefArray(scene,Geometry::MTY_CURVES,false,numPrimitives,prims,scene->progressInterface);

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.size()*sizeof(typename BVH::OBBNode)/(4*N);
        const size_t leaf_bytes = CurvePrimitive::bytes(pinfo.size());
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
        
        /* builder settings */
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxBuildDepthLeaf;
        settings.logBlockSize = bsf(CurvePrimitive::max_size());
        settings.minLeafSize = CurvePrimitive::max_size();
        settings.maxLeafSize = CurvePrimitive::max_size();
        settings.finished_range_threshold = numPrimitives/1000;
        if (settings.finished_range_threshold < 1000)
          settings.finished_range_threshold = inf;

        /* creates a leaf node */
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& set, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
          
          if (set.size() == 0)
            return BVH::emptyNode;

          const unsigned int geomID0 = prims[set.begin()].geomID();
          if (scene->get(geomID0)->getTypeMask() & Geometry::MTY_POINTS)
            return PointPrimitive::createLeaf(bvh,prims,set,alloc);
          else if (scene->get(geomID0)->getCurveBasis() == Geometry::GTY_BASIS_LINEAR)
            return LinePrimitive::createLeaf(bvh,prims,set,alloc);
          else
            return CurvePrimitive::createLeaf(bvh,prims,set,alloc);
        };
        
        auto reportFinishedRange = [&] (const range<size_t>& range) -> void
          {
            PrimRef* begin = prims.data()+range.begin();
            PrimRef* end   = prims.data()+range.end(); // FIXME: extended end for spatial split builder!!!!!
            size_t bytes = (size_t)end - (size_t)begin;
            bvh->alloc.addBlock(begin,bytes);
          };
          
        /* build hierarchy */
        typename BVH::NodeRef root = BVHBuilderHair::build<NodeRef>
          (typename BVH::CreateAlloc(bvh),
           typename BVH::AABBNode::Create(),
           typename BVH::AABBNode::Set(),
           typename BVH::OBBNode::Create(),
           typename BVH::OBBNode::Set(),
           createLeaf,scene->progressInterface,
           reportFinishedRange,
           scene,prims.data(),pinfo,settings);
        
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        
        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.share(prims);
        
        /* clear temporary data for static geometry */
        if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }